

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v10::format_facet<std::locale>::format_facet(format_facet<std::locale> *this,locale *loc)

{
  char cVar1;
  ulong uVar2;
  allocator local_71;
  string local_70 [32];
  string local_50 [48];
  numpunct *local_20;
  numpunct<char> *numpunct;
  locale *loc_local;
  format_facet<std::locale> *this_local;
  
  numpunct = (numpunct<char> *)loc;
  loc_local = (locale *)this;
  std::locale::facet::facet(&this->super_facet,0);
  *(undefined ***)this = &PTR__format_facet_003136e8;
  std::__cxx11::string::string((string *)&this->separator_);
  std::__cxx11::string::string((string *)&this->grouping_);
  std::__cxx11::string::string((string *)&this->decimal_point_);
  local_20 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)numpunct);
  std::__cxx11::numpunct<char>::grouping();
  std::__cxx11::string::operator=((string *)&this->grouping_,local_50);
  std::__cxx11::string::~string(local_50);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cVar1 = std::__cxx11::numpunct<char>::thousands_sep();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,1,cVar1,&local_71);
    std::__cxx11::string::operator=((string *)&this->separator_,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

format_facet<Locale>::format_facet(Locale& loc) {
  auto& numpunct = std::use_facet<std::numpunct<char>>(loc);
  grouping_ = numpunct.grouping();
  if (!grouping_.empty()) separator_ = std::string(1, numpunct.thousands_sep());
}